

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scoped_ptr.hpp
# Opt level: O0

void __thiscall
asio::detail::scoped_ptr<asio::detail::posix_thread>::reset
          (scoped_ptr<asio::detail::posix_thread> *this,posix_thread *p)

{
  void *pvVar1;
  pthread_t in_RSI;
  posix_thread *in_RDI;
  
  pvVar1 = (void *)in_RDI->thread_;
  if (pvVar1 != (void *)0x0) {
    posix_thread::~posix_thread(in_RDI);
    operator_delete(pvVar1);
  }
  in_RDI->thread_ = in_RSI;
  return;
}

Assistant:

void reset(T* p = 0)
  {
    delete p_;
    p_ = p;
  }